

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleHashCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer this_01;
  ulong uVar6;
  string local_3b0;
  string local_390 [32];
  undefined1 local_370 [8];
  ostringstream e_1;
  undefined1 local_1f0 [8];
  string out;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  ostringstream local_198 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 != 3) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar4 = std::operator<<((ostream *)local_198,(string *)pvVar3);
    std::operator<<(poVar4," requires a file name and output variable");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&hash);
    std::__cxx11::string::~string((string *)&hash);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_198);
    goto LAB_003cd9fa;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](args,0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCryptoHash::New((cmCryptoHash *)((long)&out.field_2 + 8),pcVar5);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(out.field_2._M_local_buf + 8));
  if (bVar1) {
    this_01 = std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::operator->
                        ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                         ((long)&out.field_2 + 8));
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,1);
    cmCryptoHash::HashFile((string *)local_1f0,this_01,pvVar3);
    uVar6 = std::__cxx11::string::empty();
    bVar1 = (uVar6 & 1) != 0;
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      poVar4 = std::operator<<((ostream *)local_370,(string *)pvVar3);
      poVar4 = std::operator<<(poVar4," failed to read file \"");
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,1);
      poVar4 = std::operator<<(poVar4,(string *)pvVar3);
      poVar4 = std::operator<<(poVar4,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::operator<<(poVar4,local_390);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
    }
    else {
      this_00 = (this->super_cmCommand).Makefile;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,pvVar3,pcVar5);
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_1f0);
    if (bVar1) goto LAB_003cd9d0;
  }
  else {
LAB_003cd9d0:
    this_local._7_1_ = 0;
  }
  std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
            ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
             ((long)&out.field_2 + 8));
LAB_003cd9fa:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleHashCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
  }

  std::unique_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0].c_str()));
  if (hash) {
    std::string out = hash->HashFile(args[1]);
    if (!out.empty()) {
      this->Makefile->AddDefinition(args[2], out.c_str());
      return true;
    }
    std::ostringstream e;
    e << args[0] << " failed to read file \"" << args[1]
      << "\": " << cmSystemTools::GetLastSystemError();
    this->SetError(e.str());
  }
  return false;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str());
  return false;
#endif
}